

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::NewFrame(void)

{
  int *piVar1;
  ImDrawList *pIVar2;
  float *pfVar3;
  ImGuiNextWindowData *pIVar4;
  ImGuiNavMoveResult *pIVar5;
  ImVec2 *pIVar6;
  ImVec2 *pIVar7;
  char *pcVar8;
  uint *puVar9;
  ImGuiWindow **ppIVar10;
  ImGuiPopupData *pIVar11;
  byte bVar12;
  ImGuiContext *pIVar13;
  ImGuiContext *pIVar14;
  ImGuiContext *pIVar15;
  ImGuiID IVar16;
  bool bVar17;
  bool bVar18;
  ImGuiID IVar19;
  ImGuiInputSource IVar20;
  ImGuiNavForward IVar21;
  int iVar22;
  ImGuiContext *ctx;
  uint *__dest;
  ImGuiWindow *pIVar23;
  ulong uVar24;
  ImGuiWindow **__dest_00;
  ImGuiPopupData *__dest_01;
  int i_1;
  int iVar25;
  ImGuiID IVar26;
  ImGuiWindow *pIVar27;
  ImGuiWindow *window;
  long lVar28;
  ImGuiDir IVar29;
  ImGuiWindow *parent_window_1;
  ImFontAtlas *pIVar30;
  ImGuiContext *g;
  ImGuiNavMoveResult *pIVar31;
  ulong uVar32;
  ImGuiID IVar33;
  float *pfVar34;
  long lVar35;
  ImGuiNavLayer IVar36;
  ImGuiID IVar37;
  ImFont *font;
  float *pfVar38;
  undefined8 in_R9;
  ImGuiContext *g_1;
  int n;
  long lVar39;
  bool *pbVar40;
  ImRect *pIVar41;
  ImGuiContext *g_6;
  ImGuiContext *pIVar42;
  ImGuiWindow *child_window;
  bool bVar43;
  bool bVar44;
  byte bVar45;
  uint uVar46;
  float fVar47;
  float fVar48;
  ImVec2 IVar49;
  float fVar57;
  ImVec2 IVar50;
  ImVec2 IVar51;
  ImVec2 IVar52;
  ImVec2 IVar53;
  ImVec2 IVar55;
  double dVar54;
  undefined1 auVar56 [16];
  float fVar58;
  ImVec2 IVar59;
  ImVec2 IVar60;
  float fVar63;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  uint uVar71;
  uint uVar72;
  ulong uVar73;
  undefined8 uVar74;
  ImRect local_40;
  
  bVar45 = 0;
  if (GImGui == (ImGuiContext *)0x0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0xe75,"NewFrame","ImGui ASSERT FAILED: %s",
                "GImGui != NULL && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
               );
  }
  pIVar13 = GImGui;
  if (GImGui->Initialized == false) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x1a81,"ErrorCheckNewFrameSanityChecks","ImGui ASSERT FAILED: %s","g.Initialized");
  }
  if (((pIVar13->IO).DeltaTime <= 0.0) && (pIVar13->FrameCount != 0)) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x1a82,"ErrorCheckNewFrameSanityChecks","ImGui ASSERT FAILED: %s",
                "(g.IO.DeltaTime > 0.0f || g.FrameCount == 0) && \"Need a positive DeltaTime!\"");
  }
  if ((pIVar13->FrameCount != 0) && (pIVar13->FrameCountEnded != pIVar13->FrameCount)) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x1a83,"ErrorCheckNewFrameSanityChecks","ImGui ASSERT FAILED: %s",
                "(g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount) && \"Forgot to call Render() or EndFrame() at the end of the previous frame?\""
               );
  }
  if (((pIVar13->IO).DisplaySize.x < 0.0) || ((pIVar13->IO).DisplaySize.y < 0.0)) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x1a84,"ErrorCheckNewFrameSanityChecks","ImGui ASSERT FAILED: %s",
                "g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f && \"Invalid DisplaySize value!\""
               );
  }
  pIVar30 = (pIVar13->IO).Fonts;
  if ((pIVar30->Fonts).Size < 1) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x1a85,"ErrorCheckNewFrameSanityChecks","ImGui ASSERT FAILED: %s",
                "g.IO.Fonts->Fonts.Size > 0 && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
               );
    pIVar30 = (pIVar13->IO).Fonts;
    if ((pIVar30->Fonts).Size < 1) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                  ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
    }
  }
  if ((*(pIVar30->Fonts).Data)->ContainerAtlas == (ImFontAtlas *)0x0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x1a86,"ErrorCheckNewFrameSanityChecks","ImGui ASSERT FAILED: %s",
                "g.IO.Fonts->Fonts[0]->IsLoaded() && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
               );
  }
  if ((pIVar13->Style).CurveTessellationTol <= 0.0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x1a87,"ErrorCheckNewFrameSanityChecks","ImGui ASSERT FAILED: %s",
                "g.Style.CurveTessellationTol > 0.0f && \"Invalid style setting!\"");
  }
  if ((pIVar13->Style).CircleSegmentMaxError <= 0.0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x1a88,"ErrorCheckNewFrameSanityChecks","ImGui ASSERT FAILED: %s",
                "g.Style.CircleSegmentMaxError > 0.0f && \"Invalid style setting!\"");
  }
  fVar47 = (pIVar13->Style).Alpha;
  if ((fVar47 < 0.0) || (1.0 < fVar47)) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x1a89,"ErrorCheckNewFrameSanityChecks","ImGui ASSERT FAILED: %s",
                "g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f && \"Invalid style setting. Alpha cannot be negative (allows us to avoid a few clamps in color computations)!\""
               );
  }
  if (((pIVar13->Style).WindowMinSize.x < 1.0) || ((pIVar13->Style).WindowMinSize.y < 1.0)) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x1a8a,"ErrorCheckNewFrameSanityChecks","ImGui ASSERT FAILED: %s",
                "g.Style.WindowMinSize.x >= 1.0f && g.Style.WindowMinSize.y >= 1.0f && \"Invalid style setting.\""
               );
  }
  if (2 < (pIVar13->Style).WindowMenuButtonPosition + 1U) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x1a8b,"ErrorCheckNewFrameSanityChecks","ImGui ASSERT FAILED: %s",
                "g.Style.WindowMenuButtonPosition == ImGuiDir_None || g.Style.WindowMenuButtonPosition == ImGuiDir_Left || g.Style.WindowMenuButtonPosition == ImGuiDir_Right"
               );
  }
  lVar39 = 0;
  do {
    if (0x200 < (pIVar13->IO).KeyMap[lVar39] + 1U) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                  ,0x1a8d,"ErrorCheckNewFrameSanityChecks","ImGui ASSERT FAILED: %s",
                  "g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < IM_ARRAYSIZE(g.IO.KeysDown) && \"io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)\""
                 );
    }
    lVar39 = lVar39 + 1;
  } while (lVar39 != 0x16);
  if ((((pIVar13->IO).ConfigFlags & 1) != 0) && ((pIVar13->IO).KeyMap[0xc] == -1)) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x1a91,"ErrorCheckNewFrameSanityChecks","ImGui ASSERT FAILED: %s",
                "g.IO.KeyMap[ImGuiKey_Space] != -1 && \"ImGuiKey_Space is not mapped, required for keyboard navigation.\""
               );
  }
  if (((pIVar13->IO).ConfigWindowsResizeFromEdges == true) &&
     (((pIVar13->IO).BackendFlags & 2) == 0)) {
    (pIVar13->IO).ConfigWindowsResizeFromEdges = false;
  }
  pIVar42 = GImGui;
  if (GImGui->SettingsLoaded == false) {
    if ((GImGui->SettingsWindows).Buf.Size != 0) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                  ,0x25e3,"UpdateSettings","ImGui ASSERT FAILED: %s","g.SettingsWindows.empty()");
    }
    pcVar8 = (pIVar42->IO).IniFilename;
    if (pcVar8 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar8);
    }
    pIVar42->SettingsLoaded = true;
  }
  if ((0.0 < pIVar42->SettingsDirtyTimer) &&
     (fVar47 = pIVar42->SettingsDirtyTimer - (pIVar42->IO).DeltaTime,
     pIVar42->SettingsDirtyTimer = fVar47, fVar47 <= 0.0)) {
    pcVar8 = (pIVar42->IO).IniFilename;
    if (pcVar8 == (char *)0x0) {
      (pIVar42->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar8);
    }
    pIVar42->SettingsDirtyTimer = 0.0;
  }
  fVar47 = (pIVar13->IO).DeltaTime;
  pIVar13->Time = (double)fVar47 + pIVar13->Time;
  pIVar13->WithinFrameScope = true;
  pIVar13->FrameCount = pIVar13->FrameCount + 1;
  pIVar13->TooltipOverrideCount = 0;
  pIVar13->WindowsActiveCount = 0;
  if ((pIVar13->MenusIdSubmittedThisFrame).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (uint *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    puVar9 = (pIVar13->MenusIdSubmittedThisFrame).Data;
    if (puVar9 != (uint *)0x0) {
      memcpy(__dest,puVar9,(long)(pIVar13->MenusIdSubmittedThisFrame).Size << 2);
      puVar9 = (pIVar13->MenusIdSubmittedThisFrame).Data;
      if ((puVar9 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar9,GImAllocatorUserData);
    }
    (pIVar13->MenusIdSubmittedThisFrame).Data = __dest;
    (pIVar13->MenusIdSubmittedThisFrame).Capacity = 0;
    fVar47 = (pIVar13->IO).DeltaTime;
  }
  pIVar42 = GImGui;
  (pIVar13->MenusIdSubmittedThisFrame).Size = 0;
  iVar22 = pIVar13->FramerateSecPerFrameIdx;
  pIVar13->FramerateSecPerFrameAccum =
       (fVar47 - pIVar13->FramerateSecPerFrame[iVar22]) + pIVar13->FramerateSecPerFrameAccum;
  pIVar13->FramerateSecPerFrame[iVar22] = fVar47;
  iVar25 = iVar22 + (int)((ulong)((long)(iVar22 + 1) * -0x77777777) >> 0x20) + 1;
  pIVar13->FramerateSecPerFrameIdx = iVar22 + 1 + ((iVar25 >> 6) - (iVar25 >> 0x1f)) * -0x78;
  uVar46 = -(uint)(0.0 < pIVar13->FramerateSecPerFrameAccum);
  (pIVar13->IO).Framerate =
       (float)(~uVar46 & 0x7f7fffff |
              (uint)(1.0 / (pIVar13->FramerateSecPerFrameAccum / 120.0)) & uVar46);
  ((pIVar13->IO).Fonts)->Locked = true;
  font = (pIVar42->IO).FontDefault;
  if (font == (ImFont *)0x0) {
    pIVar30 = (pIVar42->IO).Fonts;
    if ((pIVar30->Fonts).Size < 1) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                  ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
    }
    font = *(pIVar30->Fonts).Data;
  }
  SetCurrentFont(font);
  if (pIVar13->Font->ContainerAtlas == (ImFontAtlas *)0x0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0xe92,"NewFrame","ImGui ASSERT FAILED: %s","g.Font->IsLoaded()");
  }
  fVar47 = (pIVar13->IO).DisplaySize.x;
  fVar64 = (pIVar13->IO).DisplaySize.y;
  (pIVar13->DrawListSharedData).ClipRectFullscreen.x = 0.0;
  (pIVar13->DrawListSharedData).ClipRectFullscreen.y = 0.0;
  (pIVar13->DrawListSharedData).ClipRectFullscreen.z = fVar47;
  (pIVar13->DrawListSharedData).ClipRectFullscreen.w = fVar64;
  fVar47 = (pIVar13->Style).CircleSegmentMaxError;
  (pIVar13->DrawListSharedData).CurveTessellationTol = (pIVar13->Style).CurveTessellationTol;
  ImDrawListSharedData::SetCircleSegmentMaxError(&pIVar13->DrawListSharedData,fVar47);
  bVar17 = (pIVar13->Style).AntiAliasedLines;
  uVar46 = (uint)bVar17;
  (pIVar13->DrawListSharedData).InitialFlags = (uint)bVar17;
  if (((pIVar13->Style).AntiAliasedLinesUseTex == true) &&
     ((pIVar13->Font->ContainerAtlas->Flags & 4) == 0)) {
    uVar46 = bVar17 | 2;
    (pIVar13->DrawListSharedData).InitialFlags = uVar46;
  }
  if ((pIVar13->Style).AntiAliasedFill == true) {
    uVar46 = uVar46 | 4;
    (pIVar13->DrawListSharedData).InitialFlags = uVar46;
  }
  if (((pIVar13->IO).BackendFlags & 8) != 0) {
    (pIVar13->DrawListSharedData).InitialFlags = uVar46 | 8;
  }
  pIVar2 = &pIVar13->BackgroundDrawList;
  ImDrawList::_ResetForNewFrame(pIVar2);
  ImDrawList::PushTextureID(pIVar2,((pIVar13->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(pIVar2);
  pIVar2 = &pIVar13->ForegroundDrawList;
  ImDrawList::_ResetForNewFrame(pIVar2);
  ImDrawList::PushTextureID(pIVar2,((pIVar13->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(pIVar2);
  (pIVar13->DrawData).Valid = false;
  (pIVar13->DrawData).CmdLists = (ImDrawList **)0x0;
  (pIVar13->DrawData).CmdListsCount = 0;
  (pIVar13->DrawData).TotalIdxCount = 0;
  (pIVar13->DrawData).TotalVtxCount = 0;
  (pIVar13->DrawData).DisplayPos.x = 0.0;
  *(undefined8 *)&(pIVar13->DrawData).DisplayPos.y = 0;
  (pIVar13->DrawData).DisplaySize.x = 0.0;
  (pIVar13->DrawData).DisplaySize.y = 0.0;
  (pIVar13->DrawData).FramebufferScale.x = 0.0;
  pIVar42 = GImGui;
  (pIVar13->DrawData).FramebufferScale.y = 0.0;
  if ((pIVar13->DragDropActive == true) &&
     (IVar26 = (pIVar13->DragDropPayload).SourceId, IVar26 == pIVar13->ActiveId)) {
    if (GImGui->ActiveId == IVar26) {
      GImGui->ActiveIdIsAlive = IVar26;
    }
    if (pIVar42->ActiveIdPreviousFrame == IVar26) {
      pIVar42->ActiveIdPreviousFrameIsAlive = true;
    }
  }
  if (pIVar13->HoveredIdPreviousFrame == 0) {
    IVar26 = pIVar13->HoveredId;
    pIVar13->HoveredIdTimer = 0.0;
    pIVar13->HoveredIdNotActiveTimer = 0.0;
    if (IVar26 == 0) goto LAB_00201d56;
LAB_00201d2f:
    fVar47 = (pIVar13->IO).DeltaTime;
    pIVar13->HoveredIdTimer = pIVar13->HoveredIdTimer + fVar47;
    IVar19 = IVar26;
    if (pIVar13->ActiveId != IVar26) {
      pIVar13->HoveredIdNotActiveTimer = fVar47 + pIVar13->HoveredIdNotActiveTimer;
      IVar19 = pIVar13->ActiveId;
    }
  }
  else {
    IVar26 = pIVar13->HoveredId;
    if (IVar26 != 0) {
      if (pIVar13->ActiveId == IVar26) {
        pIVar13->HoveredIdNotActiveTimer = 0.0;
      }
      goto LAB_00201d2f;
    }
LAB_00201d56:
    IVar26 = 0;
    IVar19 = pIVar13->ActiveId;
  }
  pIVar13->HoveredIdPreviousFrame = IVar26;
  pIVar13->HoveredId = 0;
  pIVar13->HoveredIdAllowOverlap = false;
  if (((pIVar13->ActiveIdIsAlive != IVar19) && (IVar19 != 0)) &&
     (pIVar13->ActiveIdPreviousFrame == IVar19)) {
    SetActiveID(0,(ImGuiWindow *)0x0);
    IVar19 = pIVar13->ActiveId;
  }
  fVar47 = (pIVar13->IO).DeltaTime;
  if (IVar19 != 0) {
    pIVar13->ActiveIdTimer = pIVar13->ActiveIdTimer + fVar47;
  }
  pIVar13->LastActiveIdTimer = pIVar13->LastActiveIdTimer + fVar47;
  pIVar13->ActiveIdPreviousFrame = IVar19;
  pIVar13->ActiveIdPreviousFrameWindow = pIVar13->ActiveIdWindow;
  pIVar13->ActiveIdPreviousFrameHasBeenEditedBefore = pIVar13->ActiveIdHasBeenEditedBefore;
  pIVar13->ActiveIdIsAlive = 0;
  pIVar13->ActiveIdHasBeenEditedThisFrame = false;
  pIVar13->ActiveIdPreviousFrameIsAlive = false;
  pIVar13->ActiveIdIsJustActivated = false;
  if (pIVar13->TempInputId == 0) {
LAB_00201e31:
    if (IVar19 == 0) {
      pIVar13->ActiveIdUsingNavDirMask = 0;
      pIVar13->ActiveIdUsingNavInputMask = 0;
      pIVar13->ActiveIdUsingKeyInputMask = 0;
    }
  }
  else if (IVar19 != pIVar13->TempInputId) {
    pIVar13->TempInputId = 0;
    goto LAB_00201e31;
  }
  pIVar13->DragDropAcceptIdPrev = pIVar13->DragDropAcceptIdCurr;
  pIVar13->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar13->DragDropAcceptIdCurr = 0;
  pIVar13->DragDropWithinSource = false;
  pIVar13->DragDropWithinTarget = false;
  pIVar13->DragDropHoldJustPressedId = 0;
  pIVar42 = GImGui;
  bVar17 = (GImGui->IO).KeyCtrl;
  uVar46 = bVar17 + 2;
  if ((GImGui->IO).KeyShift == false) {
    uVar46 = (uint)bVar17;
  }
  uVar71 = uVar46 + 4;
  if ((GImGui->IO).KeyAlt == false) {
    uVar71 = uVar46;
  }
  uVar46 = uVar71 + 8;
  if ((GImGui->IO).KeySuper == false) {
    uVar46 = uVar71;
  }
  (pIVar13->IO).KeyMods = uVar46;
  pfVar3 = (pIVar13->IO).KeysDownDuration;
  memcpy((pIVar13->IO).KeysDownDurationPrev,pfVar3,0x800);
  lVar39 = 0;
  do {
    fVar64 = -1.0;
    if ((pIVar13->IO).KeysDown[lVar39] == true) {
      fVar64 = 0.0;
      if (0.0 <= pfVar3[lVar39]) {
        fVar64 = pfVar3[lVar39] + fVar47;
      }
    }
    pfVar3[lVar39] = fVar64;
    lVar39 = lVar39 + 1;
  } while (lVar39 != 0x200);
  (pIVar42->IO).WantSetMousePos = false;
  pIVar42->NavWrapRequestWindow = (ImGuiWindow *)0x0;
  pIVar42->NavWrapRequestFlags = 0;
  uVar46 = (pIVar42->IO).ConfigFlags;
  if (((uVar46 & 2) == 0) || (((pIVar42->IO).BackendFlags & 1) == 0)) {
    bVar12 = 0;
  }
  else if (((0.0 < (pIVar42->IO).NavInputs[0]) || (0.0 < (pIVar42->IO).NavInputs[2])) ||
          ((0.0 < (pIVar42->IO).NavInputs[1] || (bVar12 = 1, 0.0 < (pIVar42->IO).NavInputs[3])))) {
    pIVar42->NavInputSource = ImGuiInputSource_NavGamepad;
    bVar12 = 1;
  }
  if ((uVar46 & 1) != 0) {
    bVar17 = IsKeyDown((pIVar42->IO).KeyMap[0xc]);
    if (bVar17) {
      (pIVar42->IO).NavInputs[0] = 1.0;
      pIVar42->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar17 = IsKeyDown((pIVar42->IO).KeyMap[0xd]);
    if (bVar17) {
      (pIVar42->IO).NavInputs[2] = 1.0;
      pIVar42->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar17 = IsKeyDown((pIVar42->IO).KeyMap[0xe]);
    if (bVar17) {
      (pIVar42->IO).NavInputs[1] = 1.0;
      pIVar42->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar17 = IsKeyDown((pIVar42->IO).KeyMap[1]);
    if (bVar17) {
      (pIVar42->IO).NavInputs[0x11] = 1.0;
      pIVar42->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar17 = IsKeyDown((pIVar42->IO).KeyMap[2]);
    if (bVar17) {
      (pIVar42->IO).NavInputs[0x12] = 1.0;
      pIVar42->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar17 = IsKeyDown((pIVar42->IO).KeyMap[3]);
    if (bVar17) {
      (pIVar42->IO).NavInputs[0x13] = 1.0;
      pIVar42->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar17 = IsKeyDown((pIVar42->IO).KeyMap[4]);
    if (bVar17) {
      (pIVar42->IO).NavInputs[0x14] = 1.0;
      pIVar42->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar17 = (pIVar42->IO).KeyCtrl;
    if (bVar17 == true) {
      (pIVar42->IO).NavInputs[0xe] = 1.0;
    }
    if ((pIVar42->IO).KeyShift == true) {
      (pIVar42->IO).NavInputs[0xf] = 1.0;
    }
    if ((bVar17 == false) && ((pIVar42->IO).KeyAlt != false)) {
      (pIVar42->IO).NavInputs[0x10] = 1.0;
    }
  }
  pfVar3 = (pIVar42->IO).NavInputsDownDuration;
  pfVar34 = pfVar3;
  pfVar38 = (pIVar42->IO).NavInputsDownDurationPrev;
  for (lVar39 = 0x15; lVar39 != 0; lVar39 = lVar39 + -1) {
    *pfVar38 = *pfVar34;
    pfVar34 = pfVar34 + (ulong)bVar45 * -2 + 1;
    pfVar38 = pfVar38 + (ulong)bVar45 * -2 + 1;
  }
  lVar39 = 0;
  do {
    fVar47 = -1.0;
    if (0.0 < (pIVar42->IO).NavInputs[lVar39]) {
      fVar47 = 0.0;
      if (0.0 <= pfVar3[lVar39]) {
        fVar47 = pfVar3[lVar39] + (pIVar42->IO).DeltaTime;
      }
    }
    pfVar3[lVar39] = fVar47;
    pIVar14 = GImGui;
    lVar39 = lVar39 + 1;
  } while (lVar39 != 0x15);
  IVar26 = pIVar42->NavInitResultId;
  if ((IVar26 != 0) &&
     (((pIVar42->NavDisableHighlight != true || (pIVar42->NavInitRequestFromMove == true)) &&
      (pIVar42->NavWindow != (ImGuiWindow *)0x0)))) {
    IVar36 = pIVar42->NavLayer;
    if (pIVar42->NavInitRequestFromMove == true) {
      SetNavID(IVar26,IVar36,0);
      IVar49 = (pIVar42->NavInitResultRectRel).Max;
      pIVar6 = &pIVar14->NavWindow->NavRectRel[(int)IVar36].Min;
      *pIVar6 = (pIVar42->NavInitResultRectRel).Min;
      pIVar6[1] = IVar49;
      pIVar14->NavMousePosDirty = true;
      pIVar14->NavDisableHighlight = false;
      pIVar14->NavDisableMouseHover = true;
    }
    else {
      SetNavID(IVar26,IVar36,0);
    }
    IVar49 = (pIVar42->NavInitResultRectRel).Max;
    pIVar6 = &pIVar42->NavWindow->NavRectRel[pIVar42->NavLayer].Min;
    *pIVar6 = (pIVar42->NavInitResultRectRel).Min;
    pIVar6[1] = IVar49;
  }
  uVar73 = (ulong)uVar46;
  pIVar42->NavInitRequest = false;
  pIVar42->NavInitRequestFromMove = false;
  pIVar42->NavInitResultId = 0;
  pIVar42->NavJustMovedToId = 0;
  pIVar14 = GImGui;
  if (pIVar42->NavMoveRequest == true) {
    IVar26 = (GImGui->NavMoveResultLocal).ID;
    if ((IVar26 == 0) && ((GImGui->NavMoveResultOther).ID == 0)) {
      if (GImGui->NavId != 0) {
        pIVar14->NavDisableHighlight = false;
        pIVar14->NavDisableMouseHover = true;
      }
    }
    else {
      pIVar5 = &GImGui->NavMoveResultOther;
      pIVar31 = &GImGui->NavMoveResultLocal;
      if (IVar26 == 0) {
        pIVar31 = pIVar5;
      }
      if ((((GImGui->NavMoveRequestFlags & 0x20) != 0) &&
          (IVar26 = (GImGui->NavMoveResultLocalVisibleSet).ID, IVar26 != 0)) &&
         (IVar26 != GImGui->NavId)) {
        pIVar31 = &GImGui->NavMoveResultLocalVisibleSet;
      }
      if (pIVar31 == pIVar5) {
LAB_002022ce:
        pIVar31 = pIVar5;
      }
      else if (((GImGui->NavMoveResultOther).ID != 0) &&
              (((GImGui->NavMoveResultOther).Window)->ParentWindow == GImGui->NavWindow)) {
        fVar47 = (GImGui->NavMoveResultOther).DistBox;
        fVar64 = pIVar31->DistBox;
        if (fVar64 <= fVar47) {
          if (((fVar47 != fVar64) || (NAN(fVar47) || NAN(fVar64))) ||
             (pfVar3 = &(GImGui->NavMoveResultOther).DistCenter,
             pIVar31->DistCenter < *pfVar3 || pIVar31->DistCenter == *pfVar3)) goto LAB_002022d1;
        }
        goto LAB_002022ce;
      }
LAB_002022d1:
      if ((GImGui->NavWindow == (ImGuiWindow *)0x0) || (pIVar31->Window == (ImGuiWindow *)0x0)) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                    ,0x2248,"NavUpdateMoveResult","ImGui ASSERT FAILED: %s",
                    "g.NavWindow && result->Window");
      }
      if (pIVar14->NavLayer == ImGuiNavLayer_Main) {
        if ((pIVar14->NavMoveRequestFlags & 0x40) == 0) {
          IVar49 = pIVar31->Window->Pos;
          IVar51 = (pIVar31->RectRel).Min;
          fVar47 = IVar49.x;
          local_40.Min.x = IVar51.x + fVar47;
          fVar64 = IVar49.y;
          local_40.Min.y = IVar51.y + fVar64;
          IVar49 = (pIVar31->RectRel).Max;
          local_40.Max.x = IVar49.x + fVar47;
          local_40.Max.y = IVar49.y + fVar64;
          IVar49 = ScrollToBringRectIntoView(pIVar31->Window,&local_40);
        }
        else {
          pIVar23 = pIVar31->Window;
          fVar47 = 0.0;
          if (pIVar14->NavMoveDir == 2) {
            fVar47 = (pIVar23->ScrollMax).y;
          }
          IVar49 = (ImVec2)((ulong)(uint)((pIVar23->Scroll).y - fVar47) << 0x20);
          (pIVar23->ScrollTarget).y = fVar47;
          (pIVar23->ScrollTargetCenterRatio).y = 0.0;
        }
        fVar47 = (pIVar31->RectRel).Min.y;
        fVar64 = (pIVar31->RectRel).Max.x;
        fVar48 = (pIVar31->RectRel).Max.y;
        (pIVar31->RectRel).Min.x = (pIVar31->RectRel).Min.x - IVar49.x;
        (pIVar31->RectRel).Min.y = fVar47 - IVar49.y;
        (pIVar31->RectRel).Max.x = fVar64 - IVar49.x;
        (pIVar31->RectRel).Max.y = fVar48 - IVar49.y;
      }
      SetActiveID(0,(ImGuiWindow *)0x0);
      pIVar14->NavWindow = pIVar31->Window;
      IVar26 = pIVar31->ID;
      if (pIVar14->NavId == IVar26) {
        IVar19 = pIVar31->FocusScopeId;
      }
      else {
        pIVar14->NavJustMovedToId = IVar26;
        IVar19 = pIVar31->FocusScopeId;
        pIVar14->NavJustMovedToFocusScopeId = IVar19;
        pIVar14->NavJustMovedToKeyMods = pIVar14->NavMoveRequestKeyMods;
      }
      pIVar15 = GImGui;
      IVar36 = pIVar14->NavLayer;
      SetNavID(IVar26,IVar36,IVar19);
      IVar49 = (pIVar31->RectRel).Max;
      pIVar6 = &pIVar15->NavWindow->NavRectRel[(int)IVar36].Min;
      *pIVar6 = (pIVar31->RectRel).Min;
      pIVar6[1] = IVar49;
      pIVar15->NavMousePosDirty = true;
      pIVar15->NavDisableHighlight = false;
      pIVar15->NavDisableMouseHover = true;
      pIVar14->NavMoveFromClampedRefRect = false;
    }
  }
  if (pIVar42->NavMoveRequestForward == ImGuiNavForward_ForwardActive) {
    if (pIVar42->NavMoveRequest == false) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                  ,0x2152,"NavUpdate","ImGui ASSERT FAILED: %s","g.NavMoveRequest");
    }
    if (((pIVar42->NavMoveResultLocal).ID == 0) && ((pIVar42->NavMoveResultOther).ID == 0)) {
      pIVar42->NavDisableHighlight = false;
    }
    pIVar42->NavMoveRequestForward = ImGuiNavForward_None;
  }
  if ((pIVar42->NavMousePosDirty == true) && (pIVar42->NavIdIsAlive == true)) {
    if ((((pIVar42->IO).ConfigFlags & 4) != 0) &&
       ((((((pIVar42->IO).BackendFlags & 4) != 0 && (pIVar42->NavDisableHighlight == false)) &&
         (pIVar42->NavDisableMouseHover == true)) && (pIVar42->NavWindow != (ImGuiWindow *)0x0)))) {
      IVar49 = NavCalcPreferredRefPos();
      (pIVar42->IO).MousePosPrev = IVar49;
      (pIVar42->IO).MousePos = IVar49;
      (pIVar42->IO).WantSetMousePos = true;
    }
    pIVar42->NavMousePosDirty = false;
  }
  pIVar42->NavIdIsAlive = false;
  pIVar42->NavJustTabbedId = 0;
  if (ImGuiNavLayer_Menu < pIVar42->NavLayer) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x2168,"NavUpdate","ImGui ASSERT FAILED: %s","g.NavLayer == 0 || g.NavLayer == 1");
  }
  pIVar23 = pIVar42->NavWindow;
  pIVar27 = pIVar23;
  if (pIVar23 != (ImGuiWindow *)0x0) {
    do {
      if ((pIVar27->Flags & 0x15000000U) != 0x1000000) {
        if (pIVar27 != pIVar23) {
          pIVar27->NavLastChildNavWindow = pIVar23;
        }
        break;
      }
      ppIVar10 = &pIVar27->ParentWindow;
      pIVar27 = *ppIVar10;
    } while (*ppIVar10 != (ImGuiWindow *)0x0);
    if ((pIVar23->NavLastChildNavWindow != (ImGuiWindow *)0x0) &&
       (pIVar42->NavLayer == ImGuiNavLayer_Main)) {
      pIVar23->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar14 = GImGui;
  pIVar23 = GetTopMostPopupModal();
  if (pIVar23 == (ImGuiWindow *)0x0) {
    if (pIVar14->NavWindowingTargetAnim == (ImGuiWindow *)0x0) {
      if (pIVar14->NavWindowingTarget != (ImGuiWindow *)0x0) goto LAB_0020261c;
LAB_0020263c:
      fVar47 = (pIVar14->IO).NavInputsDownDuration[3];
      if ((((pIVar14->IO).KeyCtrl == true) && (iVar22 = (pIVar14->IO).KeyMap[0], -1 < iVar22)) &&
         (bVar17 = IsKeyPressed(iVar22,true), bVar17)) {
        bVar45 = (byte)(pIVar14->IO).ConfigFlags;
        uVar46 = (uint)bVar45;
        if (fVar47 == 0.0 || (bVar45 & 1) != 0) {
LAB_0020269c:
          pIVar23 = pIVar14->NavWindow;
          if ((pIVar23 != (ImGuiWindow *)0x0) ||
             (pIVar23 = FindWindowNavFocusable
                                  ((pIVar14->WindowsFocusOrder).Size + -1,-0x7fffffff,-1),
             pIVar23 != (ImGuiWindow *)0x0)) {
            pIVar23 = pIVar23->RootWindow;
            pIVar14->NavWindowingTargetAnim = pIVar23;
            pIVar14->NavWindowingTarget = pIVar23;
            pIVar14->NavWindowingTimer = 0.0;
            pIVar14->NavWindowingHighlightAlpha = 0.0;
            pIVar14->NavWindowingToggleLayer = (bool)(~(byte)uVar46 & 1);
            pIVar14->NavInputSource = ImGuiInputSource_NavGamepad - (uVar46 & 1);
          }
        }
      }
      else if ((fVar47 == 0.0) && (!NAN(fVar47))) {
        uVar46 = 0;
        goto LAB_0020269c;
      }
      fVar47 = (pIVar14->IO).DeltaTime + pIVar14->NavWindowingTimer;
      pIVar14->NavWindowingTimer = fVar47;
      if (pIVar14->NavWindowingTarget != (ImGuiWindow *)0x0) goto LAB_00202736;
LAB_002028e5:
      bVar17 = false;
      pIVar23 = (ImGuiWindow *)0x0;
    }
    else {
      if (pIVar14->NavWindowingTarget == (ImGuiWindow *)0x0) {
        fVar47 = (pIVar14->IO).DeltaTime * -10.0 + pIVar14->NavWindowingHighlightAlpha;
        fVar47 = (float)(-(uint)(0.0 <= fVar47) & (uint)fVar47);
        pIVar14->NavWindowingHighlightAlpha = fVar47;
        if ((pIVar14->DimBgRatio <= 0.0) && (fVar47 <= 0.0)) {
          pIVar14->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
        }
        goto LAB_0020263c;
      }
LAB_0020261c:
      fVar47 = (pIVar14->IO).DeltaTime + pIVar14->NavWindowingTimer;
      pIVar14->NavWindowingTimer = fVar47;
LAB_00202736:
      IVar20 = pIVar14->NavInputSource;
      if (IVar20 != ImGuiInputSource_NavGamepad) {
LAB_00202849:
        if (IVar20 == ImGuiInputSource_NavKeyboard) {
          fVar64 = (pIVar14->NavWindowingTimer + -0.2) / 0.05;
          fVar47 = 1.0;
          if (fVar64 <= 1.0) {
            fVar47 = fVar64;
          }
          fVar47 = (float)(~-(uint)(fVar64 < 0.0) & (uint)fVar47);
          uVar46 = -(uint)(fVar47 <= pIVar14->NavWindowingHighlightAlpha);
          pIVar14->NavWindowingHighlightAlpha =
               (float)(uVar46 & (uint)pIVar14->NavWindowingHighlightAlpha | ~uVar46 & (uint)fVar47);
          iVar22 = (GImGui->IO).KeyMap[0];
          if ((-1 < iVar22) && (bVar17 = IsKeyPressed(iVar22,true), bVar17)) {
            NavUpdateWindowingHighlightWindow((pIVar14->IO).KeyShift - 1 | 1);
          }
          if ((pIVar14->IO).KeyCtrl == false) {
            pIVar23 = pIVar14->NavWindowingTarget;
            bVar17 = false;
            goto LAB_00202939;
          }
        }
        goto LAB_002028e5;
      }
      fVar64 = (fVar47 + -0.2) / 0.05;
      fVar47 = 1.0;
      if (fVar64 <= 1.0) {
        fVar47 = fVar64;
      }
      fVar47 = (float)(~-(uint)(fVar64 < 0.0) & (uint)fVar47);
      uVar46 = -(uint)(fVar47 <= pIVar14->NavWindowingHighlightAlpha);
      fVar48 = (float)(uVar46 & (uint)pIVar14->NavWindowingHighlightAlpha | ~uVar46 & (uint)fVar47);
      pIVar14->NavWindowingHighlightAlpha = fVar48;
      fVar47 = GetNavInputAmount(0xc,ImGuiInputReadMode_RepeatSlow);
      fVar64 = GetNavInputAmount(0xd,ImGuiInputReadMode_RepeatSlow);
      iVar22 = (uint)(0.0 < fVar47) - (uint)(0.0 < fVar64);
      if (iVar22 != 0) {
        NavUpdateWindowingHighlightWindow(iVar22);
        pIVar14->NavWindowingHighlightAlpha = 1.0;
        fVar48 = 1.0;
      }
      if (0.0 < (GImGui->IO).NavInputs[3]) {
        if (pIVar14->NavWindowingTarget == (ImGuiWindow *)0x0) goto LAB_002028e5;
        IVar20 = pIVar14->NavInputSource;
        goto LAB_00202849;
      }
      pbVar40 = &pIVar14->NavWindowingToggleLayer;
      *pbVar40 = (bool)(*pbVar40 & fVar48 < 1.0);
      if (*pbVar40 == false) {
        pIVar23 = pIVar14->NavWindowingTarget;
        bVar17 = false;
      }
      else {
        bVar17 = pIVar14->NavWindow != (ImGuiWindow *)0x0;
        pIVar23 = (ImGuiWindow *)0x0;
      }
      pIVar14->NavWindowingTarget = (ImGuiWindow *)0x0;
    }
LAB_00202939:
    pIVar15 = GImGui;
    fVar47 = (GImGui->IO).NavInputsDownDuration[0x10];
    if ((fVar47 == 0.0) && (!NAN(fVar47))) {
      pIVar14->NavWindowingToggleLayer = true;
    }
    if ((((pIVar14->ActiveId == 0) || (pIVar14->ActiveIdAllowOverlap == true)) && (fVar47 < 0.0)) &&
       ((pIVar14->NavWindowingToggleLayer != false &&
        (0.0 <= (pIVar15->IO).NavInputsDownDurationPrev[0x10])))) {
      bVar43 = IsMousePosValid(&(pIVar14->IO).MousePos);
      bVar44 = IsMousePosValid(&(pIVar14->IO).MousePosPrev);
      bVar17 = (bool)(bVar44 == bVar43 | bVar17);
    }
    pIVar27 = pIVar14->NavWindowingTarget;
    if ((pIVar27 != (ImGuiWindow *)0x0) && ((pIVar27->Flags & 4) == 0)) {
      IVar20 = pIVar14->NavInputSource;
      if ((IVar20 == ImGuiInputSource_NavGamepad) ||
         ((IVar49.x = 0.0, IVar49.y = 0.0, IVar20 == ImGuiInputSource_NavKeyboard &&
          (IVar20 = ImGuiInputSource_Mouse, (pIVar14->IO).KeyShift == false)))) {
        IVar49 = GetNavInputAmount2d(IVar20,ImGuiInputReadMode_Down,0.0,0.0);
      }
      fVar47 = IVar49.y;
      if (((IVar49.x != 0.0) || (fVar47 != 0.0)) || (NAN(fVar47))) {
        fVar64 = (pIVar14->IO).DisplayFramebufferScale.x;
        fVar48 = (pIVar14->IO).DisplayFramebufferScale.y;
        if (fVar48 <= fVar64) {
          fVar64 = fVar48;
        }
        fVar64 = (float)(int)(fVar64 * (pIVar14->IO).DeltaTime * 800.0);
        IVar51 = pIVar27->RootWindow->Pos;
        local_40.Min.x = IVar51.x + IVar49.x * fVar64;
        local_40.Min.y = IVar51.y + fVar47 * fVar64;
        SetWindowPos(pIVar27->RootWindow,&local_40.Min,1);
        pIVar14->NavDisableMouseHover = true;
        if (((pIVar14->NavWindowingTarget->Flags & 0x100) == 0) &&
           (GImGui->SettingsDirtyTimer <= 0.0)) {
          GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
        }
      }
    }
    if (pIVar23 != (ImGuiWindow *)0x0) {
      if ((pIVar14->NavWindow == (ImGuiWindow *)0x0) || (pIVar23 != pIVar14->NavWindow->RootWindow))
      {
        SetActiveID(0,(ImGuiWindow *)0x0);
        pIVar14->NavDisableHighlight = false;
        pIVar14->NavDisableMouseHover = true;
        pIVar27 = pIVar23->NavLastChildNavWindow;
        if (pIVar23->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
          pIVar27 = pIVar23;
        }
        ClosePopupsOverWindow(pIVar27,false);
        FocusWindow(pIVar27);
        if (pIVar27->NavLastIds[0] == 0) {
          NavInitWindow(pIVar27,false);
        }
        if ((pIVar27->DC).NavLayerActiveMask == 2) {
          pIVar14->NavLayer = ImGuiNavLayer_Menu;
        }
      }
      pIVar14->NavWindowingTarget = (ImGuiWindow *)0x0;
    }
    if ((bVar17) && (pIVar23 = pIVar14->NavWindow, pIVar27 = pIVar23, pIVar23 != (ImGuiWindow *)0x0)
       ) {
      while (window = pIVar27, window->ParentWindow != (ImGuiWindow *)0x0) {
        if ((((window->DC).NavLayerActiveMask & 2) != 0) ||
           (pIVar27 = window->ParentWindow, (window->Flags & 0x15000000U) != 0x1000000)) break;
      }
      if (window != pIVar23) {
        FocusWindow(window);
        window->NavLastChildNavWindow = pIVar23;
        pIVar23 = pIVar14->NavWindow;
      }
      pIVar14->NavDisableHighlight = false;
      pIVar14->NavDisableMouseHover = true;
      IVar36 = ImGuiNavLayer_Main;
      if (((pIVar23->DC).NavLayerActiveMask & 2) != 0) {
        IVar36 = pIVar14->NavLayer ^ ImGuiNavLayer_Menu;
      }
      NavRestoreLayer(IVar36);
    }
  }
  else {
    pIVar14->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if (((bool)((uVar73 & 1) == 0 & (bVar12 ^ 1))) || (pIVar42->NavWindow == (ImGuiWindow *)0x0)) {
    (pIVar42->IO).NavActive = false;
LAB_00202c00:
    bVar17 = pIVar42->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  else {
    bVar17 = (pIVar42->NavWindow->Flags & 0x40000U) == 0;
    (pIVar42->IO).NavActive = bVar17;
    if (((!bVar17) || (pIVar42->NavId == 0)) ||
       (bVar17 = true, pIVar42->NavDisableHighlight != false)) goto LAB_00202c00;
  }
  (pIVar42->IO).NavVisible = bVar17;
  fVar47 = (GImGui->IO).NavInputsDownDuration[1];
  if ((fVar47 == 0.0) && (!NAN(fVar47))) {
    if (pIVar42->ActiveId == 0) {
      pIVar23 = pIVar42->NavWindow;
      if (((pIVar23 == (ImGuiWindow *)0x0) || ((pIVar23->Flags & 0x5000000U) != 0x1000000)) ||
         (pIVar27 = pIVar23->ParentWindow, pIVar27 == (ImGuiWindow *)0x0)) {
        iVar22 = (pIVar42->OpenPopupStack).Size;
        if ((long)iVar22 < 1) {
          if (pIVar42->NavLayer == ImGuiNavLayer_Main) {
            if ((pIVar23 != (ImGuiWindow *)0x0) && ((pIVar23->Flags & 0x5000000U) != 0x1000000)) {
              pIVar23->NavLastIds[0] = 0;
            }
            pIVar42->NavId = 0;
            pIVar42->NavFocusScopeId = 0;
          }
          else {
            NavRestoreLayer(ImGuiNavLayer_Main);
          }
        }
        else if ((((pIVar42->OpenPopupStack).Data[(long)iVar22 + -1].Window)->Flags & 0x8000000) ==
                 0) {
          ClosePopupToLevel(iVar22 + -1,true);
        }
      }
      else {
        if (pIVar23->ChildId == 0) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                      ,0x2184,"NavUpdate","ImGui ASSERT FAILED: %s","child_window->ChildId != 0");
        }
        FocusWindow(pIVar27);
        SetNavID(pIVar23->ChildId,0,0);
        pIVar42->NavIdIsAlive = false;
        if (pIVar42->NavDisableMouseHover == true) {
          pIVar42->NavMousePosDirty = true;
        }
      }
    }
    else if ((GImGui->ActiveIdUsingNavInputMask & 2) == 0) {
      SetActiveID(0,(ImGuiWindow *)0x0);
    }
  }
  pIVar42->NavActivateId = 0;
  pIVar42->NavActivateDownId = 0;
  pIVar42->NavActivatePressedId = 0;
  pIVar14 = GImGui;
  pIVar42->NavInputId = 0;
  IVar26 = pIVar42->NavId;
  IVar19 = 0;
  if (((IVar26 == 0) || (pIVar42->NavDisableHighlight != false)) ||
     (pIVar42->NavWindowingTarget != (ImGuiWindow *)0x0)) {
    IVar33 = 0;
LAB_00202d84:
    if ((pIVar42->NavWindow != (ImGuiWindow *)0x0) && ((pIVar42->NavWindow->Flags & 0x40000) != 0))
    {
      pIVar42->NavDisableHighlight = true;
    }
    if (IVar19 != IVar33 && IVar33 != 0) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                  ,0x21b2,"NavUpdate","ImGui ASSERT FAILED: %s",
                  "g.NavActivateDownId == g.NavActivateId");
    }
  }
  else if (pIVar42->NavWindow != (ImGuiWindow *)0x0) {
    IVar33 = 0;
    if ((pIVar42->NavWindow->Flags & 0x40000) == 0) {
      if (0.0 < (GImGui->IO).NavInputs[0]) {
        fVar47 = (GImGui->IO).NavInputsDownDuration[0];
        IVar16 = IVar26;
        if (0.0 <= fVar47) {
          IVar37 = pIVar42->ActiveId;
          if (IVar37 == 0 && fVar47 == 0.0) {
            pIVar42->NavActivateId = IVar26;
            pIVar42->NavActivateDownId = IVar26;
            IVar33 = IVar26;
          }
          else {
            if (IVar37 == 0) {
              pIVar42->NavActivateDownId = IVar26;
            }
            else {
              if (IVar37 != IVar26) goto LAB_0020328e;
              pIVar42->NavActivateDownId = IVar26;
            }
            IVar33 = 0;
            if ((fVar47 != 0.0) || (IVar33 = 0, NAN(fVar47))) goto LAB_002043bd;
          }
          pIVar42->NavActivatePressedId = IVar26;
        }
        else {
          IVar37 = pIVar42->ActiveId;
          if ((IVar37 != 0) && (IVar37 != IVar26)) goto LAB_0020328e;
          pIVar42->NavActivateDownId = IVar26;
          IVar33 = 0;
        }
      }
      else {
        IVar37 = pIVar42->ActiveId;
        if (IVar37 == 0) {
          IVar33 = 0;
          IVar16 = 0;
        }
        else {
LAB_0020328e:
          IVar19 = 0;
          IVar33 = 0;
          IVar16 = 0;
          if (IVar37 != IVar26) goto LAB_00202d84;
        }
      }
LAB_002043bd:
      IVar19 = IVar16;
      fVar47 = (pIVar14->IO).NavInputsDownDuration[2];
      if ((fVar47 == 0.0) && (!NAN(fVar47))) {
        pIVar42->NavInputId = IVar26;
      }
    }
    goto LAB_00202d84;
  }
  pIVar42->NavMoveRequest = false;
  IVar26 = pIVar42->NavNextActivateId;
  if (IVar26 != 0) {
    pIVar42->NavActivateId = IVar26;
    pIVar42->NavActivateDownId = IVar26;
    pIVar42->NavActivatePressedId = IVar26;
    pIVar42->NavInputId = IVar26;
  }
  pIVar42->NavNextActivateId = 0;
  IVar21 = pIVar42->NavMoveRequestForward;
  if (IVar21 == ImGuiNavForward_None) {
    pIVar42->NavMoveDir = -1;
    pIVar42->NavMoveRequestFlags = 0;
    IVar29 = -1;
    if (((pIVar42->NavWindow != (ImGuiWindow *)0x0) &&
        (pIVar42->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       ((pIVar42->NavWindow->Flags & 0x40000) == 0)) {
      uVar46 = GImGui->ActiveIdUsingNavDirMask;
      IVar29 = -1;
      if (((uVar46 & 1) == 0) &&
         ((fVar47 = GetNavInputAmount(4,ImGuiInputReadMode_Repeat), 0.0 < fVar47 ||
          (fVar47 = GetNavInputAmount(0x11,ImGuiInputReadMode_Repeat), 0.0 < fVar47)))) {
        pIVar42->NavMoveDir = 0;
        IVar29 = 0;
      }
      if (((uVar46 & 2) == 0) &&
         ((fVar47 = GetNavInputAmount(5,ImGuiInputReadMode_Repeat), 0.0 < fVar47 ||
          (fVar47 = GetNavInputAmount(0x12,ImGuiInputReadMode_Repeat), 0.0 < fVar47)))) {
        pIVar42->NavMoveDir = 1;
        IVar29 = 1;
      }
      if (((uVar46 & 4) == 0) &&
         ((fVar47 = GetNavInputAmount(6,ImGuiInputReadMode_Repeat), 0.0 < fVar47 ||
          (fVar47 = GetNavInputAmount(0x13,ImGuiInputReadMode_Repeat), 0.0 < fVar47)))) {
        pIVar42->NavMoveDir = 2;
        IVar29 = 2;
      }
      if (((uVar46 & 8) == 0) &&
         ((fVar47 = GetNavInputAmount(7,ImGuiInputReadMode_Repeat), 0.0 < fVar47 ||
          (fVar47 = GetNavInputAmount(0x14,ImGuiInputReadMode_Repeat), 0.0 < fVar47)))) {
        pIVar42->NavMoveDir = 3;
        IVar29 = 3;
      }
    }
    pIVar42->NavMoveClipDir = IVar29;
  }
  else {
    if ((pIVar42->NavMoveDir == -1) || (pIVar42->NavMoveClipDir == -1)) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                  ,0x21cd,"NavUpdate","ImGui ASSERT FAILED: %s",
                  "g.NavMoveDir != ImGuiDir_None && g.NavMoveClipDir != ImGuiDir_None");
      IVar21 = pIVar42->NavMoveRequestForward;
    }
    if (IVar21 != ImGuiNavForward_ForwardQueued) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                  ,0x21ce,"NavUpdate","ImGui ASSERT FAILED: %s",
                  "g.NavMoveRequestForward == ImGuiNavForward_ForwardQueued");
    }
    pIVar42->NavMoveRequestForward = ImGuiNavForward_ForwardActive;
  }
  pIVar14 = GImGui;
  fVar47 = 0.0;
  uVar46 = 0;
  uVar71 = 0;
  uVar72 = 0;
  if ((((((uVar73 & 1) != 0) && (GImGui->NavMoveDir == -1)) &&
       (pIVar23 = GImGui->NavWindow, pIVar23 != (ImGuiWindow *)0x0)) &&
      (((pIVar23->Flags & 0x40000) == 0 && (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)))) &&
     (GImGui->NavLayer == ImGuiNavLayer_Main)) {
    bVar17 = IsKeyDown((GImGui->IO).KeyMap[5]);
    bVar44 = false;
    bVar43 = false;
    if (bVar17) {
      bVar43 = (GImGui->ActiveIdUsingKeyInputMask & 0x20) == 0;
    }
    bVar17 = IsKeyDown((pIVar14->IO).KeyMap[6]);
    if (bVar17) {
      bVar44 = (GImGui->ActiveIdUsingKeyInputMask & 0x40) == 0;
    }
    bVar17 = IsKeyPressed((pIVar14->IO).KeyMap[7],true);
    if (bVar17) {
      bVar17 = (GImGui->ActiveIdUsingKeyInputMask & 0x80) == 0;
    }
    else {
      bVar17 = false;
    }
    bVar18 = IsKeyPressed((pIVar14->IO).KeyMap[8],true);
    if (bVar18) {
      bVar18 = (GImGui->ActiveIdUsingKeyInputMask & 0x100) == 0;
    }
    else {
      bVar18 = false;
    }
    fVar47 = 0.0;
    uVar46 = 0;
    uVar71 = 0;
    uVar72 = 0;
    if ((bVar43 != bVar44) || (bVar17 != bVar18)) {
      if (((pIVar23->DC).NavLayerActiveMask == 0) && ((pIVar23->DC).NavHasScroll == true)) {
        bVar43 = IsKeyPressed((pIVar14->IO).KeyMap[5],true);
        if (bVar43) {
          (pIVar23->ScrollTarget).y =
               (pIVar23->Scroll).y - ((pIVar23->InnerRect).Max.y - (pIVar23->InnerRect).Min.y);
LAB_0020465d:
          (pIVar23->ScrollTargetCenterRatio).y = 0.0;
        }
        else {
          bVar43 = IsKeyPressed((pIVar14->IO).KeyMap[6],true);
          if (bVar43) {
            fVar47 = ((pIVar23->InnerRect).Max.y - (pIVar23->InnerRect).Min.y) + (pIVar23->Scroll).y
            ;
LAB_00204657:
            (pIVar23->ScrollTarget).y = fVar47;
            goto LAB_0020465d;
          }
          if (bVar17 == false) {
            if (bVar18 != false) {
              fVar47 = (pIVar23->ScrollMax).y;
              goto LAB_00204657;
            }
          }
          else {
            (pIVar23->ScrollTarget).y = 0.0;
            (pIVar23->ScrollTargetCenterRatio).y = 0.0;
          }
        }
LAB_00204665:
        fVar47 = 0.0;
        uVar46 = 0;
        uVar71 = 0;
        uVar72 = 0;
      }
      else {
        IVar36 = pIVar14->NavLayer;
        pIVar41 = pIVar23->NavRectRel + IVar36;
        fVar47 = GImGui->FontBaseSize * pIVar23->FontWindowScale;
        if (pIVar23->ParentWindow != (ImGuiWindow *)0x0) {
          fVar47 = fVar47 * pIVar23->ParentWindow->FontWindowScale;
        }
        fVar47 = (pIVar23->NavRectRel[IVar36].Max.y - pIVar23->NavRectRel[IVar36].Min.y) +
                 (((pIVar23->InnerRect).Max.y - (pIVar23->InnerRect).Min.y) - fVar47);
        uVar73 = (ulong)(~-(uint)(fVar47 <= 0.0) & (uint)fVar47);
        uVar74 = 0;
        bVar43 = IsKeyPressed((pIVar14->IO).KeyMap[5],true);
        if (bVar43) {
          fVar47 = -(float)uVar73;
          uVar46 = (uint)(uVar73 >> 0x20) ^ 0x80000000;
          uVar71 = (uint)uVar74 ^ 0x80000000;
          uVar72 = (uint)((ulong)uVar74 >> 0x20) ^ 0x80000000;
          pIVar14->NavMoveDir = 3;
          pIVar14->NavMoveClipDir = 2;
          pIVar14->NavMoveRequestFlags = 0x30;
        }
        else {
          bVar43 = IsKeyPressed((pIVar14->IO).KeyMap[6],true);
          if (bVar43) {
            pIVar14->NavMoveDir = 2;
            pIVar14->NavMoveClipDir = 3;
            pIVar14->NavMoveRequestFlags = 0x30;
            fVar47 = (float)uVar73;
            uVar46 = (uint)(uVar73 >> 0x20);
            uVar71 = (uint)uVar74;
            uVar72 = (uint)((ulong)uVar74 >> 0x20);
          }
          else {
            if (bVar17 != false) {
              fVar47 = -(pIVar23->Scroll).y;
              pIVar23->NavRectRel[IVar36].Max.y = fVar47;
              pIVar23->NavRectRel[IVar36].Min.y = fVar47;
              fVar47 = (pIVar41->Min).x;
              pIVar6 = &pIVar23->NavRectRel[IVar36].Max;
              if (pIVar6->x <= fVar47 && fVar47 != pIVar6->x) {
                pIVar23->NavRectRel[IVar36].Max.x = 0.0;
                (pIVar41->Min).x = 0.0;
              }
              pIVar14->NavMoveDir = 3;
              pIVar14->NavMoveRequestFlags = 0x50;
              goto LAB_00204665;
            }
            fVar47 = 0.0;
            uVar46 = 0;
            uVar71 = 0;
            uVar72 = 0;
            if (bVar18 != false) {
              fVar64 = ((pIVar23->ScrollMax).y + (pIVar23->SizeFull).y) - (pIVar23->Scroll).y;
              pIVar23->NavRectRel[IVar36].Max.y = fVar64;
              pIVar23->NavRectRel[IVar36].Min.y = fVar64;
              fVar64 = (pIVar41->Min).x;
              pIVar6 = &pIVar23->NavRectRel[IVar36].Max;
              if (pIVar6->x <= fVar64 && fVar64 != pIVar6->x) {
                pIVar23->NavRectRel[IVar36].Max.x = 0.0;
                (pIVar41->Min).x = 0.0;
              }
              pIVar14->NavMoveDir = 2;
              pIVar14->NavMoveRequestFlags = 0x50;
            }
          }
        }
      }
    }
  }
  if (pIVar42->NavMoveDir == -1) {
    if ((pIVar42->NavMoveRequest & 1U) != 0) goto LAB_0020304f;
  }
  else {
    pIVar42->NavMoveRequest = true;
    pIVar42->NavMoveRequestKeyMods = (pIVar42->IO).KeyMods;
    pIVar42->NavMoveDirLast = pIVar42->NavMoveDir;
LAB_0020304f:
    if (pIVar42->NavId == 0) {
      pIVar42->NavInitRequest = true;
      pIVar42->NavInitRequestFromMove = true;
      pIVar42->NavInitResultId = 0;
      pIVar42->NavDisableHighlight = false;
    }
  }
  pIVar14 = GImGui;
  if (GImGui->NavMoveRequest == false) {
    pbVar40 = &GImGui->NavInitRequest;
    GImGui->NavAnyRequest = *pbVar40;
    if (*pbVar40 != false) goto LAB_0020309f;
  }
  else {
    GImGui->NavAnyRequest = true;
LAB_0020309f:
    if (pIVar14->NavWindow == (ImGuiWindow *)0x0) {
      uVar74 = CONCAT44(uVar46,fVar47);
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                  ,0x20ba,"NavUpdateAnyRequestFlag","ImGui ASSERT FAILED: %s","g.NavWindow != NULL",
                  in_R9,uVar74,CONCAT44(uVar72,uVar71));
      fVar47 = (float)uVar74;
    }
  }
  pIVar23 = pIVar42->NavWindow;
  if (((pIVar23 != (ImGuiWindow *)0x0) && ((pIVar23->Flags & 0x40000) == 0)) &&
     (pIVar42->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar64 = GImGui->FontBaseSize * pIVar23->FontWindowScale;
    if (pIVar23->ParentWindow != (ImGuiWindow *)0x0) {
      fVar64 = fVar64 * pIVar23->ParentWindow->FontWindowScale;
    }
    fVar64 = (float)(int)(fVar64 * 100.0 * (pIVar42->IO).DeltaTime + 0.5);
    if ((((pIVar23->DC).NavLayerActiveMask == 0) && ((pIVar23->DC).NavHasScroll == true)) &&
       (pIVar42->NavMoveRequest == true)) {
      uVar46 = pIVar42->NavMoveDir;
      if (uVar46 < 2) {
        lVar39 = 0x6c;
        lVar28 = 100;
        uVar71 = 0;
        lVar35 = 0x54;
      }
      else {
        if ((uVar46 & 0xfffffffe) != 2) goto LAB_00203370;
        lVar39 = 0x70;
        lVar28 = 0x68;
        uVar71 = 2;
        lVar35 = 0x58;
      }
      *(float *)((long)&pIVar23->Name + lVar28) =
           (float)(int)(*(float *)(&DAT_0027b52c + (ulong)(uVar46 == uVar71) * 4) * fVar64 +
                       *(float *)((long)&pIVar23->Name + lVar35));
      *(undefined4 *)((long)&pIVar23->Name + lVar39) = 0;
    }
LAB_00203370:
    IVar49 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.1,10.0);
    fVar48 = IVar49.x;
    fVar57 = IVar49.y;
    if (((fVar48 != 0.0) || (NAN(fVar48))) && (pIVar23->ScrollbarX == true)) {
      (pIVar23->ScrollTarget).x = (float)(int)(fVar48 * fVar64 + (pIVar23->Scroll).x);
      (pIVar23->ScrollTargetCenterRatio).x = 0.0;
      pIVar42->NavMoveFromClampedRefRect = true;
    }
    if ((fVar57 != 0.0) || (NAN(fVar57))) {
      (pIVar23->ScrollTarget).y = (float)(int)(fVar57 * fVar64 + (pIVar23->Scroll).y);
      (pIVar23->ScrollTargetCenterRatio).y = 0.0;
      pIVar42->NavMoveFromClampedRefRect = true;
    }
  }
  (pIVar42->NavMoveResultLocal).Window = (ImGuiWindow *)0x0;
  (pIVar42->NavMoveResultLocal).ID = 0;
  (pIVar42->NavMoveResultLocal).FocusScopeId = 0;
  (pIVar42->NavMoveResultLocal).DistAxial = 3.4028235e+38;
  (pIVar42->NavMoveResultLocal).DistBox = 3.4028235e+38;
  (pIVar42->NavMoveResultLocal).DistCenter = 3.4028235e+38;
  (pIVar42->NavMoveResultLocal).RectRel.Min.x = 0.0;
  (pIVar42->NavMoveResultLocal).RectRel.Min.y = 0.0;
  (pIVar42->NavMoveResultLocal).RectRel.Max.x = 0.0;
  (pIVar42->NavMoveResultLocal).RectRel.Max.y = 0.0;
  (pIVar42->NavMoveResultLocalVisibleSet).Window = (ImGuiWindow *)0x0;
  (pIVar42->NavMoveResultLocalVisibleSet).ID = 0;
  (pIVar42->NavMoveResultLocalVisibleSet).FocusScopeId = 0;
  (pIVar42->NavMoveResultLocalVisibleSet).DistAxial = 3.4028235e+38;
  (pIVar42->NavMoveResultLocalVisibleSet).DistBox = 3.4028235e+38;
  (pIVar42->NavMoveResultLocalVisibleSet).DistCenter = 3.4028235e+38;
  (pIVar42->NavMoveResultLocalVisibleSet).RectRel.Min.x = 0.0;
  (pIVar42->NavMoveResultLocalVisibleSet).RectRel.Min.y = 0.0;
  (pIVar42->NavMoveResultLocalVisibleSet).RectRel.Max.x = 0.0;
  (pIVar42->NavMoveResultLocalVisibleSet).RectRel.Max.y = 0.0;
  (pIVar42->NavMoveResultOther).Window = (ImGuiWindow *)0x0;
  (pIVar42->NavMoveResultOther).ID = 0;
  (pIVar42->NavMoveResultOther).FocusScopeId = 0;
  (pIVar42->NavMoveResultOther).DistAxial = 3.4028235e+38;
  (pIVar42->NavMoveResultOther).DistBox = 3.4028235e+38;
  (pIVar42->NavMoveResultOther).DistCenter = 3.4028235e+38;
  (pIVar42->NavMoveResultOther).RectRel.Min.x = 0.0;
  (pIVar42->NavMoveResultOther).RectRel.Min.y = 0.0;
  (pIVar42->NavMoveResultOther).RectRel.Max.x = 0.0;
  (pIVar42->NavMoveResultOther).RectRel.Max.y = 0.0;
  if (((pIVar42->NavMoveRequest == true) && (pIVar42->NavMoveFromClampedRefRect == true)) &&
     (pIVar42->NavLayer == ImGuiNavLayer_Main)) {
    IVar49 = (pIVar23->InnerRect).Min;
    fVar64 = (pIVar23->Pos).x;
    fVar57 = (pIVar23->Pos).y;
    fVar58 = (IVar49.x - fVar64) + -1.0;
    fVar63 = (IVar49.y - fVar57) + -1.0;
    IVar49 = (pIVar23->InnerRect).Max;
    fVar48 = (IVar49.x - fVar64) + 1.0;
    fVar57 = (IVar49.y - fVar57) + 1.0;
    fVar64 = pIVar23->NavRectRel[0].Min.x;
    if (((fVar64 < fVar58) || (pIVar23->NavRectRel[0].Min.y < fVar63)) ||
       ((fVar48 < pIVar23->NavRectRel[0].Max.x || (fVar57 < pIVar23->NavRectRel[0].Max.y)))) {
      fVar67 = GImGui->FontBaseSize * pIVar23->FontWindowScale;
      if (pIVar23->ParentWindow != (ImGuiWindow *)0x0) {
        fVar67 = fVar67 * pIVar23->ParentWindow->FontWindowScale;
      }
      auVar68._0_4_ = fVar67 * 0.5;
      auVar69._0_4_ = fVar48 - fVar58;
      auVar69._4_4_ = fVar57 - fVar63;
      auVar69._8_8_ = 0;
      auVar68._4_4_ = auVar68._0_4_;
      auVar68._8_4_ = auVar68._0_4_;
      auVar68._12_4_ = auVar68._0_4_;
      auVar70 = minps(auVar69,auVar68);
      fVar58 = fVar58 + auVar70._0_4_;
      fVar63 = fVar63 + auVar70._4_4_;
      fVar67 = pIVar23->NavRectRel[0].Min.y;
      uVar46 = -(uint)(fVar58 <= fVar64);
      uVar71 = -(uint)(fVar63 <= fVar67);
      auVar61._0_4_ = fVar48 - auVar70._0_4_;
      auVar61._4_4_ = fVar57 - auVar70._4_4_;
      auVar61._8_4_ = 0.0 - auVar70._8_4_;
      auVar61._12_4_ = 0.0 - auVar70._12_4_;
      auVar70._8_8_ = 0;
      auVar70._0_4_ = pIVar23->NavRectRel[0].Max.x;
      auVar70._4_4_ = pIVar23->NavRectRel[0].Max.y;
      auVar61 = minps(auVar70,auVar61);
      pIVar23->NavRectRel[0].Min =
           (ImVec2)(CONCAT44(~uVar71 & (uint)fVar63,~uVar46 & (uint)fVar58) |
                   CONCAT44((uint)fVar67 & uVar71,(uint)fVar64 & uVar46));
      pIVar23->NavRectRel[0].Max = auVar61._0_8_;
      pIVar42->NavId = 0;
      pIVar42->NavFocusScopeId = 0;
      pIVar23 = pIVar42->NavWindow;
    }
    pIVar42->NavMoveFromClampedRefRect = false;
  }
  if (pIVar23 == (ImGuiWindow *)0x0) {
    IVar51 = (GImGui->IO).DisplaySize;
    fVar64 = 0.0;
    fVar48 = 0.0;
  }
  else {
    IVar49 = pIVar23->NavRectRel[pIVar42->NavLayer].Min;
    IVar51 = pIVar23->NavRectRel[pIVar42->NavLayer].Max;
    IVar50.x = 0.0;
    IVar50.y = 0.0;
    IVar59.x = 0.0;
    IVar59.y = 0.0;
    if (IVar49.y <= IVar51.y && IVar49.x <= IVar51.x) {
      IVar50 = IVar51;
      IVar59 = IVar49;
    }
    fVar57 = (pIVar23->Pos).x;
    fVar64 = IVar59.x + fVar57;
    fVar58 = (pIVar23->Pos).y;
    fVar48 = IVar59.y + fVar58;
    IVar51.x = IVar50.x + fVar57;
    IVar51.y = IVar50.y + fVar58;
  }
  (pIVar42->NavScoringRect).Min.y = fVar48 + fVar47;
  fVar58 = IVar51.y + fVar47;
  (pIVar42->NavScoringRect).Max.y = fVar58;
  fVar57 = fVar64 + 1.0;
  if (IVar51.x <= fVar64 + 1.0) {
    fVar57 = IVar51.x;
  }
  (pIVar42->NavScoringRect).Min.x = fVar57;
  (pIVar42->NavScoringRect).Max.x = fVar57;
  if (fVar58 < fVar48 + fVar47) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x2220,"NavUpdate","ImGui ASSERT FAILED: %s","!g.NavScoringRect.IsInverted()");
  }
  pIVar42->NavScoringCount = 0;
  pIVar42 = GImGui;
  pIVar6 = &(GImGui->IO).MousePos;
  bVar17 = IsMousePosValid(pIVar6);
  if (bVar17) {
    IVar49 = (pIVar42->IO).MousePos;
    IVar52.x = (float)(int)IVar49.x;
    IVar52.y = (float)(int)IVar49.y;
    pIVar42->LastValidMousePos = IVar52;
    (pIVar42->IO).MousePos = IVar52;
  }
  bVar17 = IsMousePosValid(pIVar6);
  if ((bVar17) && (bVar17 = IsMousePosValid(&(pIVar42->IO).MousePosPrev), bVar17)) {
    IVar49 = (pIVar42->IO).MousePos;
    IVar51 = (pIVar42->IO).MousePosPrev;
    IVar53.x = IVar49.x - IVar51.x;
    IVar53.y = IVar49.y - IVar51.y;
    (pIVar42->IO).MouseDelta = IVar53;
    if ((((IVar53.x != 0.0) || (NAN(IVar53.x))) || (IVar53.y != 0.0)) || (NAN(IVar53.y))) {
      pIVar42->NavDisableMouseHover = false;
    }
  }
  else {
    (pIVar42->IO).MouseDelta.x = 0.0;
    (pIVar42->IO).MouseDelta.y = 0.0;
  }
  (pIVar42->IO).MousePosPrev = (pIVar42->IO).MousePos;
  lVar39 = 0;
  do {
    if ((pIVar42->IO).MouseDown[lVar39] == true) {
      fVar47 = (pIVar42->IO).MouseDownDuration[lVar39];
      pbVar40 = (pIVar42->IO).MouseClicked + lVar39;
      *pbVar40 = fVar47 < 0.0;
      pbVar40[10] = false;
      (pIVar42->IO).MouseDownDurationPrev[lVar39] = fVar47;
      if (0.0 <= fVar47) {
        (pIVar42->IO).MouseDownDuration[lVar39] = fVar47 + (pIVar42->IO).DeltaTime;
        (pIVar42->IO).MouseDoubleClicked[lVar39] = false;
        bVar17 = IsMousePosValid(pIVar6);
        auVar56 = ZEXT816(0);
        if (bVar17) {
          IVar49 = (pIVar42->IO).MousePos;
          IVar51 = (pIVar42->IO).MouseClickedPos[lVar39];
          auVar56._0_4_ = IVar49.x - IVar51.x;
          auVar56._4_4_ = IVar49.y - IVar51.y;
          auVar56._8_8_ = 0;
        }
        fVar47 = (pIVar42->IO).MouseDragMaxDistanceSqr[lVar39];
        fVar64 = auVar56._0_4_ * auVar56._0_4_ + auVar56._4_4_ * auVar56._4_4_;
        uVar46 = -(uint)(fVar64 <= fVar47);
        (pIVar42->IO).MouseDragMaxDistanceSqr[lVar39] =
             (float)(~uVar46 & (uint)fVar64 | (uint)fVar47 & uVar46);
        IVar49 = (pIVar42->IO).MouseDragMaxDistanceAbs[lVar39];
        auVar65._0_8_ = auVar56._0_8_ ^ 0x8000000080000000;
        auVar65._8_4_ = auVar56._8_4_ ^ 0x80000000;
        auVar65._12_4_ = auVar56._12_4_ ^ 0x80000000;
        auVar61 = maxps(auVar65,auVar56);
        fVar47 = IVar49.x;
        fVar64 = IVar49.y;
        uVar46 = -(uint)(auVar61._0_4_ <= fVar47);
        uVar71 = -(uint)(auVar61._4_4_ <= fVar64);
        (pIVar42->IO).MouseDragMaxDistanceAbs[lVar39] =
             (ImVec2)(CONCAT44(~uVar71 & (uint)auVar61._4_4_,~uVar46 & (uint)auVar61._0_4_) |
                     CONCAT44((uint)fVar64 & uVar71,(uint)fVar47 & uVar46));
      }
      else {
        (pIVar42->IO).MouseDownDuration[lVar39] = 0.0;
        (pIVar42->IO).MouseDoubleClicked[lVar39] = false;
        dVar54 = pIVar42->Time;
        if ((float)(dVar54 - (pIVar42->IO).MouseClickedTime[lVar39]) <
            (pIVar42->IO).MouseDoubleClickTime) {
          bVar17 = IsMousePosValid(pIVar6);
          fVar47 = 0.0;
          fVar64 = 0.0;
          if (bVar17) {
            IVar49 = (pIVar42->IO).MousePos;
            IVar51 = (pIVar42->IO).MouseClickedPos[lVar39];
            fVar47 = IVar49.x - IVar51.x;
            fVar64 = IVar49.y - IVar51.y;
          }
          fVar48 = (pIVar42->IO).MouseDoubleClickMaxDist;
          if (fVar47 * fVar47 + fVar64 * fVar64 < fVar48 * fVar48) {
            (pIVar42->IO).MouseDoubleClicked[lVar39] = true;
          }
          dVar54 = (double)((pIVar42->IO).MouseDoubleClickTime * -2.0);
        }
        (pIVar42->IO).MouseClickedTime[lVar39] = dVar54;
        (pIVar42->IO).MouseClickedPos[lVar39] = (pIVar42->IO).MousePos;
        (pIVar42->IO).MouseDownWasDoubleClick[lVar39] = (pIVar42->IO).MouseDoubleClicked[lVar39];
        pIVar7 = (pIVar42->IO).MouseDragMaxDistanceAbs + lVar39;
        pIVar7->x = 0.0;
        pIVar7->y = 0.0;
        (pIVar42->IO).MouseDragMaxDistanceSqr[lVar39] = 0.0;
      }
    }
    else {
      (pIVar42->IO).MouseClicked[lVar39] = false;
      fVar47 = (pIVar42->IO).MouseDownDuration[lVar39];
      (pIVar42->IO).MouseReleased[lVar39] = 0.0 <= fVar47;
      pbVar40 = (pIVar42->IO).MouseClicked + lVar39;
      (pIVar42->IO).MouseDownDurationPrev[lVar39] = fVar47;
      (pIVar42->IO).MouseDownDuration[lVar39] = -1.0;
      (pIVar42->IO).MouseDoubleClicked[lVar39] = false;
    }
    if (((pIVar42->IO).MouseDown[lVar39] == false) && ((pIVar42->IO).MouseReleased[lVar39] == false)
       ) {
      (pIVar42->IO).MouseDownWasDoubleClick[lVar39] = false;
    }
    if (*pbVar40 == true) {
      pIVar42->NavDisableMouseHover = false;
    }
    lVar39 = lVar39 + 1;
  } while (lVar39 != 5);
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar23 = GetTopMostPopupModal();
  if ((pIVar23 != (ImGuiWindow *)0x0) ||
     ((pIVar13->NavWindowingTarget != (ImGuiWindow *)0x0 &&
      (0.0 < pIVar13->NavWindowingHighlightAlpha)))) {
    fVar47 = (pIVar13->IO).DeltaTime * 6.0 + pIVar13->DimBgRatio;
    if (1.0 <= fVar47) {
      fVar47 = 1.0;
    }
    pIVar13->DimBgRatio = fVar47;
  }
  else {
    fVar47 = (pIVar13->IO).DeltaTime * -10.0 + pIVar13->DimBgRatio;
    pIVar13->DimBgRatio = (float)(-(uint)(0.0 <= fVar47) & (uint)fVar47);
  }
  pIVar13->MouseCursor = 0;
  pIVar13->WantTextInputNextFrame = -1;
  pIVar13->WantCaptureMouseNextFrame = -1;
  pIVar13->WantCaptureKeyboardNextFrame = -1;
  (pIVar13->PlatformImePos).x = 1.0;
  pIVar42 = GImGui;
  (pIVar13->PlatformImePos).y = 1.0;
  if (GImGui->WheelingWindow != (ImGuiWindow *)0x0) {
    GImGui->WheelingWindowTimer = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
    bVar17 = IsMousePosValid((ImVec2 *)0x0);
    if (((bVar17) &&
        (fVar47 = (pIVar42->IO).MouseDragThreshold,
        fVar64 = (pIVar42->IO).MousePos.x - (pIVar42->WheelingWindowRefMousePos).x,
        fVar48 = (pIVar42->IO).MousePos.y - (pIVar42->WheelingWindowRefMousePos).y,
        fVar47 * fVar47 < fVar64 * fVar64 + fVar48 * fVar48)) ||
       (pIVar42->WheelingWindowTimer <= 0.0)) {
      pIVar42->WheelingWindow = (ImGuiWindow *)0x0;
      pIVar42->WheelingWindowTimer = 0.0;
    }
  }
  pIVar14 = GImGui;
  fVar47 = (pIVar42->IO).MouseWheel;
  if (((((fVar47 != 0.0) || (fVar64 = (pIVar42->IO).MouseWheelH, fVar64 != 0.0)) || (NAN(fVar64)))
      && ((pIVar23 = pIVar42->WheelingWindow, pIVar23 != (ImGuiWindow *)0x0 ||
          (pIVar23 = pIVar42->HoveredWindow, pIVar23 != (ImGuiWindow *)0x0)))) &&
     (pIVar23->Collapsed == false)) {
    if ((fVar47 != 0.0) || (NAN(fVar47))) {
      if ((pIVar42->IO).KeyCtrl == true) {
        if ((pIVar42->IO).FontAllowUserScaling == true) {
          if (GImGui->WheelingWindow != pIVar23) {
            GImGui->WheelingWindow = pIVar23;
            pIVar14->WheelingWindowRefMousePos = (pIVar14->IO).MousePos;
            pIVar14->WheelingWindowTimer = 2.0;
            fVar47 = (pIVar42->IO).MouseWheel;
          }
          fVar64 = pIVar23->FontWindowScale;
          fVar48 = fVar47 * 0.1 + fVar64;
          fVar47 = 2.5;
          if (fVar48 <= 2.5) {
            fVar47 = fVar48;
          }
          fVar47 = (float)(-(uint)(fVar48 < 0.5) & 0x3f000000 |
                          ~-(uint)(fVar48 < 0.5) & (uint)fVar47);
          pIVar23->FontWindowScale = fVar47;
          if ((pIVar23->Flags & 0x1000000) == 0) {
            fVar47 = fVar47 / fVar64;
            IVar49 = pIVar23->Size;
            auVar62._8_8_ = 0;
            auVar62._0_4_ = IVar49.x;
            auVar62._4_4_ = IVar49.y;
            IVar51 = (pIVar42->IO).MousePos;
            fVar64 = (pIVar23->Pos).x;
            fVar48 = (pIVar23->Pos).y;
            auVar66._0_4_ = (IVar51.x - fVar64) * (1.0 - fVar47) * IVar49.x;
            auVar66._4_4_ = (IVar51.y - fVar48) * (1.0 - fVar47) * IVar49.y;
            auVar66._8_8_ = 0;
            auVar61 = divps(auVar66,auVar62);
            local_40.Min.x = auVar61._0_4_ + fVar64;
            local_40.Min.y = auVar61._4_4_ + fVar48;
            SetWindowPos(pIVar23,&local_40.Min,0);
            IVar55.x = (float)(int)((pIVar23->Size).x * fVar47);
            IVar55.y = (float)(int)((pIVar23->Size).y * fVar47);
            IVar60.x = (float)(int)((pIVar23->SizeFull).x * fVar47);
            IVar60.y = (float)(int)((pIVar23->SizeFull).y * fVar47);
            pIVar23->Size = IVar55;
            pIVar23->SizeFull = IVar60;
          }
          goto LAB_00203b19;
        }
      }
      else if ((pIVar42->IO).KeyShift == false) {
        if (GImGui->WheelingWindow != pIVar23) {
          GImGui->WheelingWindow = pIVar23;
          pIVar14->WheelingWindowRefMousePos = (pIVar14->IO).MousePos;
          pIVar14->WheelingWindowTimer = 2.0;
        }
        uVar46 = pIVar23->Flags;
        while (((uVar46 >> 0x18 & 1) != 0 &&
               (((uVar46 & 0x210) == 0x10 ||
                ((fVar64 = (pIVar23->ScrollMax).y, fVar64 == 0.0 && (!NAN(fVar64)))))))) {
          pIVar23 = pIVar23->ParentWindow;
          uVar46 = pIVar23->Flags;
        }
        if ((uVar46 & 0x210) == 0) {
          fVar64 = ((pIVar23->InnerRect).Max.y - (pIVar23->InnerRect).Min.y) * 0.67;
          fVar48 = pIVar14->FontBaseSize * pIVar23->FontWindowScale;
          if (pIVar23->ParentWindow != (ImGuiWindow *)0x0) {
            fVar48 = fVar48 * pIVar23->ParentWindow->FontWindowScale;
          }
          fVar57 = fVar48 * 5.0;
          if (fVar64 <= fVar48 * 5.0) {
            fVar57 = fVar64;
          }
          (pIVar23->ScrollTarget).y = (pIVar23->Scroll).y - fVar47 * (float)(int)fVar57;
          (pIVar23->ScrollTargetCenterRatio).y = 0.0;
        }
      }
    }
    pIVar14 = GImGui;
    fVar47 = (pIVar42->IO).MouseWheelH;
    if (((fVar47 == 0.0) && (!NAN(fVar47))) || ((pIVar42->IO).KeyShift == true)) {
      fVar47 = (pIVar42->IO).MouseWheel;
      if (((fVar47 == 0.0) && (!NAN(fVar47))) || ((pIVar42->IO).KeyShift != true))
      goto LAB_00203b19;
    }
    if ((pIVar42->IO).KeyCtrl == false) {
      if (GImGui->WheelingWindow != pIVar23) {
        GImGui->WheelingWindow = pIVar23;
        pIVar14->WheelingWindowRefMousePos = (pIVar14->IO).MousePos;
        pIVar14->WheelingWindowTimer = 2.0;
      }
      uVar46 = pIVar23->Flags;
      while (((uVar46 >> 0x18 & 1) != 0 &&
             (((uVar46 & 0x210) == 0x10 ||
              ((fVar64 = (pIVar23->ScrollMax).x, fVar64 == 0.0 && (!NAN(fVar64)))))))) {
        pIVar23 = pIVar23->ParentWindow;
        uVar46 = pIVar23->Flags;
      }
      if ((uVar46 & 0x210) == 0) {
        fVar64 = ((pIVar23->InnerRect).Max.x - (pIVar23->InnerRect).Min.x) * 0.67;
        fVar48 = pIVar14->FontBaseSize * pIVar23->FontWindowScale;
        if (pIVar23->ParentWindow != (ImGuiWindow *)0x0) {
          fVar48 = fVar48 * pIVar23->ParentWindow->FontWindowScale;
        }
        fVar57 = fVar48 + fVar48;
        if (fVar64 <= fVar48 + fVar48) {
          fVar57 = fVar64;
        }
        (pIVar23->ScrollTarget).x = (pIVar23->Scroll).x - fVar47 * (float)(int)fVar57;
        (pIVar23->ScrollTargetCenterRatio).x = 0.0;
      }
    }
  }
LAB_00203b19:
  pIVar42 = GImGui;
  pIVar23 = GImGui->NavWindow;
  if ((((pIVar23 == (ImGuiWindow *)0x0) || (pIVar23->Active != true)) ||
      ((pIVar23->Flags & 0x40000) != 0)) ||
     (((GImGui->IO).KeyCtrl != false || (iVar22 = (GImGui->IO).KeyMap[0], iVar22 < 0)))) {
    GImGui->FocusTabPressed = false;
  }
  else {
    bVar17 = IsKeyPressed(iVar22,true);
    pIVar42->FocusTabPressed = bVar17;
    if ((bVar17) && (pIVar42->ActiveId == 0)) {
      pIVar23 = pIVar42->NavWindow;
      pIVar42->FocusRequestNextWindow = pIVar23;
      pIVar42->FocusRequestNextCounterRegular = 0x7fffffff;
      if ((pIVar42->NavId == 0) || (pIVar42->NavIdTabCounter == 0x7fffffff)) {
        iVar22 = -(uint)(pIVar42->IO).KeyShift;
      }
      else {
        iVar22 = pIVar42->NavIdTabCounter + (-(uint)(pIVar42->IO).KeyShift | 1) + 1;
      }
      pIVar42->FocusRequestNextCounterTabStop = iVar22;
      goto LAB_00203bb3;
    }
  }
  pIVar23 = pIVar42->FocusRequestNextWindow;
LAB_00203bb3:
  pIVar42->FocusRequestCurrWindow = (ImGuiWindow *)0x0;
  pIVar42->FocusRequestCurrCounterRegular = 0x7fffffff;
  pIVar42->FocusRequestCurrCounterTabStop = 0x7fffffff;
  if (pIVar23 != (ImGuiWindow *)0x0) {
    pIVar42->FocusRequestCurrWindow = pIVar23;
    if ((pIVar42->FocusRequestNextCounterRegular != 0x7fffffff) &&
       (iVar22 = (pIVar23->DC).FocusCounterRegular, iVar22 != -1)) {
      pIVar42->FocusRequestCurrCounterRegular =
           (pIVar42->FocusRequestNextCounterRegular + iVar22 + 1) % (iVar22 + 1);
    }
    if ((pIVar42->FocusRequestNextCounterTabStop != 0x7fffffff) &&
       (iVar22 = (pIVar23->DC).FocusCounterTabStop, iVar22 != -1)) {
      pIVar42->FocusRequestCurrCounterTabStop =
           (pIVar42->FocusRequestNextCounterTabStop + iVar22 + 1) % (iVar22 + 1);
    }
    pIVar42->FocusRequestNextWindow = (ImGuiWindow *)0x0;
    pIVar42->FocusRequestNextCounterRegular = 0x7fffffff;
    pIVar42->FocusRequestNextCounterTabStop = 0x7fffffff;
  }
  pIVar42->NavIdTabCounter = 0x7fffffff;
  if ((pIVar13->WindowsFocusOrder).Size != (pIVar13->Windows).Size) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0xeff,"NewFrame","ImGui ASSERT FAILED: %s",
                "g.WindowsFocusOrder.Size == g.Windows.Size");
  }
  fVar47 = (pIVar13->IO).ConfigWindowsMemoryCompactTimer;
  if (0.0 <= fVar47) {
    uVar73 = (ulong)(uint)((float)pIVar13->Time - fVar47);
  }
  else {
    uVar73 = 0x7f7fffff;
  }
  uVar46 = (pIVar13->Windows).Size;
  uVar24 = (ulong)uVar46;
  if (uVar46 != 0) {
    uVar32 = 0;
    do {
      if ((long)(int)uVar24 <= (long)uVar32) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                    ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
      }
      pIVar23 = (pIVar13->Windows).Data[uVar32];
      bVar17 = pIVar23->Active;
      pIVar23->WasActive = bVar17;
      pIVar23->BeginCount = 0;
      pIVar23->Active = false;
      pIVar23->WriteAccessed = false;
      if (((bVar17 == false) && (pIVar23->MemoryCompacted == false)) &&
         (pIVar23->LastTimeActive <= (float)uVar73 && (float)uVar73 != pIVar23->LastTimeActive)) {
        GcCompactTransientWindowBuffers(pIVar23);
      }
      uVar32 = uVar32 + 1;
      uVar24 = (ulong)(uint)(pIVar13->Windows).Size;
    } while (uVar32 != uVar24);
  }
  if ((pIVar13->NavWindow != (ImGuiWindow *)0x0) && (pIVar13->NavWindow->WasActive == false)) {
    FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
  }
  if ((pIVar13->CurrentWindowStack).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest_00 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    ppIVar10 = (pIVar13->CurrentWindowStack).Data;
    if (ppIVar10 != (ImGuiWindow **)0x0) {
      memcpy(__dest_00,ppIVar10,(long)(pIVar13->CurrentWindowStack).Size << 3);
      ppIVar10 = (pIVar13->CurrentWindowStack).Data;
      if ((ppIVar10 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar10,GImAllocatorUserData);
    }
    (pIVar13->CurrentWindowStack).Data = __dest_00;
    (pIVar13->CurrentWindowStack).Capacity = 0;
  }
  (pIVar13->CurrentWindowStack).Size = 0;
  if ((pIVar13->BeginPopupStack).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest_01 = (ImGuiPopupData *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    pIVar11 = (pIVar13->BeginPopupStack).Data;
    if (pIVar11 != (ImGuiPopupData *)0x0) {
      memcpy(__dest_01,pIVar11,(long)(pIVar13->BeginPopupStack).Size * 0x30);
      pIVar11 = (pIVar13->BeginPopupStack).Data;
      if ((pIVar11 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar11,GImAllocatorUserData);
    }
    (pIVar13->BeginPopupStack).Data = __dest_01;
    (pIVar13->BeginPopupStack).Capacity = 0;
  }
  (pIVar13->BeginPopupStack).Size = 0;
  ClosePopupsOverWindow(pIVar13->NavWindow,false);
  pIVar42 = GImGui;
  GImGui->DebugItemPickerBreakId = 0;
  if (pIVar42->DebugItemPickerActive == true) {
    uVar46 = pIVar42->HoveredIdPreviousFrame;
    pIVar42->MouseCursor = 7;
    iVar22 = (pIVar42->IO).KeyMap[0xe];
    if ((-1 < iVar22) && (bVar17 = IsKeyPressed(iVar22,true), bVar17)) {
      pIVar42->DebugItemPickerActive = false;
    }
    pIVar14 = GImGui;
    fVar47 = (GImGui->IO).MouseDownDuration[0];
    if ((fVar47 != 0.0) || (NAN(fVar47))) {
      uVar71 = (uint)(uVar46 == 0);
    }
    else if (uVar46 == 0) {
      uVar71 = 1;
    }
    else {
      pIVar42->DebugItemPickerBreakId = uVar46;
      pIVar42->DebugItemPickerActive = false;
      uVar71 = 0;
    }
    pIVar4 = &pIVar14->NextWindowData;
    *(byte *)&pIVar4->Flags = (byte)pIVar4->Flags | 0x40;
    (pIVar14->NextWindowData).BgAlphaVal = 0.6;
    BeginTooltipEx(0,0);
    Text("HoveredId: 0x%08X",(ulong)uVar46);
    Text("Press ESC to abort picking.");
    TextColored((ImVec4 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uVar71 << 4)),
                "Click to break in debugger!");
    EndTooltip();
    pIVar42 = GImGui;
  }
  pIVar13->WithinFrameScopeWithImplicitWindow = true;
  *(byte *)&(pIVar42->NextWindowData).Flags = (byte)(pIVar42->NextWindowData).Flags | 2;
  (pIVar42->NextWindowData).SizeVal.x = 400.0;
  (pIVar42->NextWindowData).SizeVal.y = 400.0;
  (pIVar42->NextWindowData).SizeCond = 4;
  Begin("Debug##Default",(bool *)0x0,0);
  if (pIVar13->CurrentWindow->IsFallbackWindow != false) {
    return;
  }
  LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
              ,0xf21,"NewFrame","ImGui ASSERT FAILED: %s",
              "g.CurrentWindow->IsFallbackWindow == true");
  return;
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiTestEngineHook_PreNewFrame(&g);
#endif

    // Check and assert for various common IO and Configuration mistakes
    ErrorCheckNewFrameSanityChecks();

    // Load settings on first frame, save settings when modified (after a delay)
    UpdateSettings();

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;
    g.MenusIdSubmittedThisFrame.resize(0);

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame))) : FLT_MAX;

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    g.DrawListSharedData.ClipRectFullscreen = ImVec4(0.0f, 0.0f, g.IO.DisplaySize.x, g.IO.DisplaySize.y);
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.SetCircleSegmentMaxError(g.Style.CircleSegmentMaxError);
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedLinesUseTex && !(g.Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines))
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLinesUseTex;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    g.BackgroundDrawList._ResetForNewFrame();
    g.BackgroundDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.BackgroundDrawList.PushClipRectFullScreen();

    g.ForegroundDrawList._ResetForNewFrame();
    g.ForegroundDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.ForegroundDrawList.PushClipRectFullScreen();

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    g.DrawData.Clear();

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Update HoveredId data
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;

    // Update ActiveId data (clear reference to active widget if the widget isn't alive anymore)
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputId != 0 && g.ActiveId != g.TempInputId)
        g.TempInputId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = 0x00;
        g.ActiveIdUsingNavInputMask = 0x00;
        g.ActiveIdUsingKeyInputMask = 0x00;
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSource = false;
    g.DragDropWithinTarget = false;
    g.DragDropHoldJustPressedId = 0;

    // Update keyboard input state
    // Synchronize io.KeyMods with individual modifiers io.KeyXXX bools
    g.IO.KeyMods = GetMergedKeyModFlags();
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Update legacy TAB focus
    UpdateTabFocus();

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size == g.Windows.Size);
    const float memory_compact_start_time = (g.IO.ConfigWindowsMemoryCompactTimer >= 0.0f) ? (float)g.Time - g.IO.ConfigWindowsMemoryCompactTimer : FLT_MAX;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect transient buffers of recently unused windows
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    ClosePopupsOverWindow(g.NavWindow, false);

    // [DEBUG] Item picker tool - start with DebugStartItemPicker() - useful to visually select an item and break into its call-stack.
    UpdateDebugToolItemPicker();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400, 400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiTestEngineHook_PostNewFrame(&g);
#endif
}